

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall
RandStrAltList::RandStrAltList(RandStrAltList *this,RandStrParser *p,int isOuterExpr)

{
  int iVar1;
  wchar_t wVar2;
  RandStrNode *chi;
  int in_EDX;
  RandStrParser *in_RSI;
  RandStrNode *in_RDI;
  bool bVar3;
  undefined4 in_stack_ffffffffffffffb0;
  wchar_t in_stack_ffffffffffffffb4;
  RandStrParser *in_stack_ffffffffffffffd8;
  RandStrCatList *in_stack_ffffffffffffffe0;
  
  RandStrNode::RandStrNode(in_RDI);
  in_RDI->_vptr_RandStrNode = (_func_int **)&PTR__RandStrAltList_003dfdb8;
  *(undefined4 *)&in_RDI[1]._vptr_RandStrNode = 0;
  while( true ) {
    iVar1 = RandStrParser::more(in_RSI);
    bVar3 = false;
    if ((iVar1 != 0) && (bVar3 = true, in_EDX == 0)) {
      wVar2 = RandStrParser::getch
                        ((RandStrParser *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      bVar3 = wVar2 != L')';
    }
    if (!bVar3) break;
    chi = (RandStrNode *)operator_new(0x20);
    RandStrCatList::RandStrCatList(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    RandStrNode::addChild(in_RDI,chi);
    *(int *)&in_RDI[1]._vptr_RandStrNode = *(int *)&in_RDI[1]._vptr_RandStrNode + 1;
    in_stack_ffffffffffffffb4 =
         RandStrParser::getch
                   ((RandStrParser *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (in_stack_ffffffffffffffb4 == L'|') {
      RandStrParser::skip((RandStrParser *)CONCAT44(0x7c,in_stack_ffffffffffffffb0));
    }
  }
  return;
}

Assistant:

RandStrAltList(RandStrParser *p, int isOuterExpr)
    {
        /* no alternatives yet */
        altCount = 0;

        /* 
         *   parse alternatives until we reach the end of the string or a
         *   close paren (unless we're the outermost expression, in which
         *   case we treat ')' as an ordinary character since there's no
         *   enclosing group to close) 
         */
        while (p->more() && (isOuterExpr || p->getch() != ')'))
        {
            /* parse the next alternative and add it to our child list */
            addChild(new RandStrCatList(p));
            altCount += 1;

            /* if there's a '|', skip it */
            if (p->getch() == '|')
                p->skip();
        }
    }